

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitSwitchStatement(SyntaxDumper *this,SwitchStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  StatementSyntax *pSVar2;
  SwitchStatementSyntax local_d0 [56];
  SwitchStatementSyntax local_98 [72];
  SwitchStatementSyntax local_50 [56];
  SwitchStatementSyntax *local_18;
  SwitchStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (SwitchStatementSyntax *)this;
  SwitchStatementSyntax::switchKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  SwitchStatementSyntax::openParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  pEVar1 = SwitchStatementSyntax::condition(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  SwitchStatementSyntax::closeParenthesisToken(local_d0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_d0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_d0);
  pSVar2 = SwitchStatementSyntax::statement(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pSVar2);
  return Skip;
}

Assistant:

virtual Action visitSwitchStatement(const SwitchStatementSyntax* node) override
    {
        terminal(node->switchKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->condition());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        return Action::Skip;
    }